

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

bool __thiscall vkb::SystemInfo::is_layer_available(SystemInfo *this,char *layer_name)

{
  pointer pVVar1;
  int iVar2;
  pointer __s2;
  bool bVar3;
  
  if (layer_name == (char *)0x0) {
    bVar3 = false;
  }
  else {
    __s2 = (this->available_layers).
           super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
           super__Vector_impl_data._M_start;
    pVVar1 = (this->available_layers).
             super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar3 = __s2 != pVVar1;
    if (bVar3) {
      iVar2 = strcmp(layer_name,__s2->layerName);
      while (iVar2 != 0) {
        __s2 = __s2 + 1;
        bVar3 = __s2 != pVVar1;
        if (__s2 == pVVar1) {
          return bVar3;
        }
        iVar2 = strcmp(layer_name,__s2->layerName);
      }
    }
  }
  return bVar3;
}

Assistant:

bool SystemInfo::is_layer_available(const char* layer_name) const {
    if (!layer_name) return false;
    return detail::check_layer_supported(available_layers, layer_name);
}